

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O2

void __thiscall ON_HatchLine::Dump(ON_HatchLine *this,ON_TextLog *dump)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  dVar5 = this->m_angle_radians;
  dVar4 = AngleDegrees(this);
  ON_TextLog::Print(dump,"ON_HatchLine: angle = %lf radians ( %lf degrees) ",dVar5,SUB84(dVar4,0));
  ON_TextLog::Print(dump," base = ");
  ON_TextLog::Print(dump,&this->m_base);
  ON_TextLog::Print(dump," offset = ");
  ON_TextLog::Print(dump,&this->m_offset);
  uVar1 = (this->m_dashes).m_count;
  ON_TextLog::Print(dump,"\nDash count = %d: ",(ulong)uVar1);
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
  }
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    dVar5 = 0.0;
    if ((long)uVar3 < (long)(this->m_dashes).m_count) {
      dVar5 = (this->m_dashes).m_a[uVar3];
    }
    ON_TextLog::Print(dump,"%lf",dVar5);
    if ((long)uVar3 < (long)(int)uVar1 + -1) {
      ON_TextLog::Print(dump,", ");
    }
  }
  ON_TextLog::Print(dump,"\n");
  return;
}

Assistant:

void ON_HatchLine::Dump( ON_TextLog& dump) const
{
  dump.Print( "ON_HatchLine: angle = %lf radians ( %lf degrees) ", 
    AngleRadians(), AngleDegrees());
  dump.Print( " base = ");
  dump.Print( m_base);
  dump.Print( " offset = ");
  dump.Print( m_offset);
  int count = m_dashes.Count();
  dump.Print( "\nDash count = %d: ", count);
  for( int i = 0; i < count; i++)
  {
    dump.Print( "%lf", Dash( i));
    if( i < count-1)
      dump.Print( ", ");
  }
  dump.Print( "\n");
}